

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector(quad_value_bit_vector *this,string *str_raw)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  int *piVar7;
  long lVar8;
  pointer pqVar9;
  char cVar10;
  long lVar11;
  uchar uVar12;
  int iVar13;
  ulong uVar14;
  string digits;
  string bv_size;
  char *local_90;
  undefined8 local_88;
  char local_80 [16];
  undefined1 *local_70;
  int local_68;
  undefined1 local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  *(undefined8 *)
   ((long)&(this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  pcVar6 = (str_raw->_M_dataplus)._M_p;
  cVar10 = *pcVar6;
  uVar14 = 0;
  if (cVar10 != '\'') {
    uVar14 = 0;
    do {
      if (9 < (int)cVar10 - 0x30U) {
        __assert_fail("isdigit(str_raw[ind])",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x12d,
                      "bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
      }
      std::__cxx11::string::push_back((char)local_50);
      pcVar6 = (str_raw->_M_dataplus)._M_p;
      cVar10 = pcVar6[uVar14 + 1];
      uVar14 = uVar14 + 1;
    } while (cVar10 != '\'');
  }
  bVar1 = pcVar6[(uVar14 & 0xffffffff) + 1];
  uVar4 = bVar1 - 0x62;
  if ((6 < uVar4) || ((0x45U >> (uVar4 & 0x1f) & 1) == 0)) {
    __assert_fail("(format == \'b\') || (format == \'h\') || (format == \'d\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x13a,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  iVar13 = (int)uVar14 + 2;
  if (iVar13 < (int)str_raw->_M_string_length) {
    do {
      std::__cxx11::string::push_back((char)&local_70);
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)str_raw->_M_string_length);
  }
  pcVar6 = local_50[0];
  piVar7 = __errno_location();
  iVar13 = *piVar7;
  *piVar7 = 0;
  lVar8 = strtol(pcVar6,&local_90,10);
  if (local_90 == pcVar6) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    iVar5 = (int)lVar8;
    if ((iVar5 == lVar8) && (*piVar7 != 0x22)) {
      if (*piVar7 == 0) {
        *piVar7 = iVar13;
      }
      this->N = iVar5;
      std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize
                (&this->bits,(long)iVar5);
      pqVar9 = (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (0 < *(int *)&(this->bits).
                       super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (int)pqVar9) {
        lVar8 = 0;
        do {
          pqVar9[lVar8].value = '\0';
          lVar8 = lVar8 + 1;
          pqVar9 = (this->bits).
                   super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (lVar8 < *(int *)&(this->bits).
                                  super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (int)pqVar9);
      }
      if (bVar1 == 0x68) {
        if (-1 < (int)(local_68 - 1U)) {
          iVar13 = 0;
          uVar14 = (ulong)(local_68 - 1U);
          uVar3 = local_88;
          cVar10 = local_80[4];
          do {
            local_80[4] = cVar10;
            local_88 = uVar3;
            bVar1 = local_70[uVar14];
            if (bVar1 < 0x61) {
              switch(bVar1) {
              case 0x30:
                builtin_strncpy(local_80,"0000",4);
                break;
              case 0x31:
                builtin_strncpy(local_80,"0001",4);
                break;
              case 0x32:
                builtin_strncpy(local_80,"0010",4);
                break;
              case 0x33:
                builtin_strncpy(local_80,"0011",4);
                break;
              case 0x34:
                builtin_strncpy(local_80,"0100",4);
                break;
              case 0x35:
                builtin_strncpy(local_80,"0101",4);
                break;
              case 0x36:
                builtin_strncpy(local_80,"0110",4);
                break;
              case 0x37:
                builtin_strncpy(local_80,"0111",4);
                break;
              case 0x38:
                builtin_strncpy(local_80,"1000",4);
                break;
              case 0x39:
                builtin_strncpy(local_80,"1001",4);
                break;
              default:
switchD_00188a44_default:
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                              ,0x41,"std::string bsim::hex_digit_to_binary(const char)");
              }
            }
            else {
              switch(bVar1) {
              case 0x61:
                builtin_strncpy(local_80,"1010",4);
                break;
              case 0x62:
                builtin_strncpy(local_80,"1011",4);
                break;
              case 99:
                builtin_strncpy(local_80,"1100",4);
                break;
              case 100:
                builtin_strncpy(local_80,"1101",4);
                break;
              case 0x65:
                builtin_strncpy(local_80,"1110",4);
                break;
              case 0x66:
                builtin_strncpy(local_80,"1111",4);
                break;
              default:
                if (bVar1 == 0x78) {
                  builtin_strncpy(local_80,"xxxx",4);
                }
                else {
                  if (bVar1 != 0x7a) goto switchD_00188a44_default;
                  builtin_strncpy(local_80,"zzzz",4);
                }
              }
            }
            local_88 = 4;
            uVar3 = local_88;
            local_80[4] = 0;
            cVar10 = local_80[4];
            iVar5 = 0;
            lVar8 = 4;
            do {
              local_90 = local_80;
              if (iVar5 + iVar13 < this->N) {
                bVar1 = *(byte *)((long)&local_88 + lVar8 + 7);
                if (bVar1 < 0x78) {
                  if (bVar1 == 0x30) {
                    uVar12 = '\0';
                  }
                  else {
                    uVar12 = '\x01';
                    if (bVar1 != 0x31) {
LAB_00188c5e:
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                                    ,0x165,
                                    "bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)"
                                   );
                    }
                  }
                }
                else if (bVar1 == 0x78) {
                  uVar12 = '\x02';
                }
                else {
                  if (bVar1 != 0x7a) goto LAB_00188c5e;
                  uVar12 = '\x03';
                }
                (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar5 + iVar13].value = uVar12;
                iVar5 = iVar5 + 1;
              }
              lVar11 = lVar8 + -1;
              bVar2 = 0 < lVar8;
              lVar8 = lVar11;
            } while (lVar11 != 0 && bVar2);
            local_80[4] = 0;
            local_88 = 4;
            iVar13 = iVar13 + 4;
            bVar2 = 0 < (long)uVar14;
            uVar14 = uVar14 - 1;
          } while (bVar2);
        }
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        return;
      }
      goto LAB_00188cf2;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_00188cf2:
  __assert_fail("format == \'h\'",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                ,0x14e,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
}

Assistant:

quad_value_bit_vector(const std::string& str_raw) : N(0) {
      std::string bv_size = "";
      int ind = 0;
      while (str_raw[ind] != '\'') {
        assert(isdigit(str_raw[ind]));
        bv_size += str_raw[ind];
        ind++;
      }

      assert (str_raw[ind] == '\'');

      ind++;

      char format = str_raw[ind];

      assert((format == 'b') ||
             (format == 'h') ||
             (format == 'd'));

      ind++;

      std::string digits = "";
      while (ind < ((int) str_raw.size())) {
        digits += str_raw[ind];
        ind++;
      }

      int num_bits = stoi(bv_size);
      N = num_bits;
      //bits.resize(NUM_BYTES(num_bits));
      bits.resize(num_bits);
      for (int i = 0; i < ((int) bits.size()); i++) {
        bits[i] = 0;
      }

      // TODO: Check that digits are not too long

      assert(format == 'h');

      int bit_ind = 0;
      for (int i = digits.size() - 1; i >= 0; i--) {
        char hex_digit = digits[i];
        std::string hex_to_binary = hex_digit_to_binary(hex_digit);

        assert(hex_to_binary.size() == 4);

        int k = 0;
        for (int j = hex_to_binary.size() - 1; j >= 0; j--) {
          // Dont add past the end
          if ((bit_ind + k) < bitLength()) {
            //std::cout << "setting digit = " << hex_to_binary[j] << std::endl;
            if (hex_to_binary[j] == '1') {
              set(bit_ind + k, quad_value(1));
            } else if (hex_to_binary[j] == '0') {
              set(bit_ind + k, quad_value(0));
            } else if (hex_to_binary[j] == 'x') {
              set(bit_ind + k, quad_value(QBV_UNKNOWN_VALUE));
            } else if (hex_to_binary[j] == 'z') {
              set(bit_ind + k, quad_value(QBV_HIGH_IMPEDANCE_VALUE));
            } else {
              assert(false);
            }
            k++;
          } else {
            //assert(hex_to_binary[j] == '0');
          }
        }
        bit_ind += 4;
      }

    }